

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

bool __thiscall
ConvexDecomposition::HullLibrary::CleanupVertices
          (HullLibrary *this,uint svcount,float *svertices,uint stride,uint *vcount,float *vertices,
          float normalepsilon,float *scale)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  undefined8 uVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  uint uVar10;
  float *pfVar11;
  uint i;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int j;
  long lVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM5 [64];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  ulong local_68;
  float local_60;
  ulong local_58;
  float local_50;
  ulong local_48;
  float bmax_1 [3];
  float bmin_1 [3];
  float bmax [3];
  float bmin [3];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  auVar23 = in_ZMM5._0_16_;
  if (svcount != 0) {
    *vcount = 0;
    if (scale != (float *)0x0) {
      auVar25._8_4_ = 0x3f800000;
      auVar25._0_8_ = 0x3f8000003f800000;
      auVar25._12_4_ = 0x3f800000;
      uVar1 = vmovlps_avx(auVar25);
      *(undefined8 *)scale = uVar1;
      scale[2] = 1.0;
    }
    bmax_1[0] = -3.4028235e+38;
    stack0xffffffffffffffc8 = 0x7f7fffff7f7fffff;
    local_48 = 0xff7fffffff7fffff;
    pfVar11 = svertices;
    for (uVar12 = 0; uVar12 != svcount; uVar12 = uVar12 + 1) {
      for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
        fVar19 = pfVar11[lVar16];
        if (fVar19 < bmax_1[lVar16 + 2]) {
          bmax_1[lVar16 + 2] = fVar19;
        }
        if (bmax_1[lVar16 + -2] < fVar19) {
          bmax_1[lVar16 + -2] = fVar19;
        }
      }
      pfVar11 = (float *)((long)pfVar11 + (ulong)stride);
    }
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_48;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = stack0xffffffffffffffc8;
    auVar25 = vsubps_avx(auVar33,auVar30);
    fVar35 = bmax_1[0] - 3.4028235e+38;
    auVar33 = vfmadd231ss_fma(ZEXT416(0x7f7fffff),ZEXT416((uint)fVar35),ZEXT416(0x3f000000));
    auVar27._8_4_ = 0x3f000000;
    auVar27._0_8_ = 0x3f0000003f000000;
    auVar27._12_4_ = 0x3f000000;
    auVar20 = vfmadd231ps_avx512vl(auVar30,auVar25,auVar27);
    auVar22._8_4_ = 0x358637bd;
    auVar22._0_8_ = 0x358637bd358637bd;
    auVar22._12_4_ = 0x358637bd;
    uVar14 = vcmpps_avx512vl(auVar25,auVar22,1);
    fVar19 = auVar33._0_4_;
    fVar38 = auVar20._4_4_;
    fVar39 = auVar20._8_4_;
    fVar3 = auVar20._12_4_;
    if ((((svcount < 3) || ((uVar14 & 1) != 0)) || ((uVar14 >> 1 & 1) != 0)) || (fVar35 < 1e-06)) {
      auVar27 = SUB6416(ZEXT464(0x358637bd),0);
      uVar1 = vcmpss_avx512f(auVar27,auVar25,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar23 = vminss_avx(auVar25,SUB6416(ZEXT464(0x7f7fffff),0));
      uVar12 = (uint)bVar2 * auVar23._0_4_ + (uint)!bVar2 * 0x7f7fffff;
      auVar33 = vmovshdup_avx(auVar25);
      auVar23 = vminss_avx(auVar33,ZEXT416(uVar12));
      uVar1 = vcmpss_avx512f(auVar27,auVar33,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      uVar12 = (uint)bVar2 * auVar23._0_4_ + !bVar2 * uVar12;
      uVar1 = vcmpps_avx512vl(auVar27,ZEXT416((uint)fVar35),1);
      uVar4 = vcmpps_avx512vl(ZEXT416((uint)fVar35),ZEXT416(uVar12),1);
      bVar5 = (byte)uVar1 & (byte)uVar4;
      fVar18 = (float)((uint)(bVar5 & 1) * (int)fVar35 + !(bool)(bVar5 & 1) * uVar12);
      if ((fVar18 != 3.4028235e+38) || (NAN(fVar18))) {
        auVar23._8_4_ = 0x358637bd;
        auVar23._0_8_ = 0x358637bd358637bd;
        auVar23._12_4_ = 0x358637bd;
        uVar14 = vcmpps_avx512vl(auVar25,auVar23,1);
        auVar23 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar18 * 0.05)));
        bVar2 = (bool)((byte)uVar14 & 1);
        auVar24._0_4_ = (uint)bVar2 * auVar23._0_4_ | (uint)!bVar2 * auVar25._0_4_;
        bVar2 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar24._4_4_ = (uint)bVar2 * auVar23._4_4_ | (uint)!bVar2 * auVar25._4_4_;
        bVar2 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar24._8_4_ = (uint)bVar2 * auVar23._8_4_ | (uint)!bVar2 * auVar25._8_4_;
        bVar2 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar24._12_4_ = (uint)bVar2 * auVar23._12_4_ | (uint)!bVar2 * auVar25._12_4_;
        fVar18 = fVar18 * 0.05;
        if (1e-06 <= fVar35) {
          fVar18 = fVar35;
        }
      }
      else {
        auVar24._8_4_ = 0x3c23d70a;
        auVar24._0_8_ = 0x3c23d70a3c23d70a;
        auVar24._12_4_ = 0x3c23d70a;
        fVar18 = 0.01;
      }
      auVar33 = vsubps_avx(auVar20,auVar24);
      auVar32._0_4_ = auVar20._0_4_ + auVar24._0_4_;
      auVar32._4_4_ = fVar38 + auVar24._4_4_;
      auVar32._8_4_ = fVar39 + auVar24._8_4_;
      auVar32._12_4_ = fVar3 + auVar24._12_4_;
      fVar35 = fVar19 - fVar18;
      fVar19 = fVar19 + fVar18;
      auVar23 = vmovshdup_avx(auVar33);
      auVar25 = vmovshdup_avx(auVar32);
      uVar1 = vmovlps_avx(auVar33);
      *(undefined8 *)vertices = uVar1;
      vertices[2] = fVar35;
      vertices[4] = auVar23._0_4_;
      vertices[5] = fVar35;
      vertices[3] = auVar32._0_4_;
      uVar1 = vmovlps_avx(auVar32);
      *(undefined8 *)(vertices + 6) = uVar1;
      vertices[8] = fVar35;
      vertices[9] = auVar33._0_4_;
      vertices[10] = auVar25._0_4_;
      vertices[0xb] = fVar35;
      uVar1 = vmovlps_avx(auVar33);
      *(undefined8 *)(vertices + 0xc) = uVar1;
      vertices[0xe] = fVar19;
      vertices[0xf] = auVar32._0_4_;
      vertices[0x10] = auVar23._0_4_;
      vertices[0x11] = fVar19;
      uVar1 = vmovlps_avx(auVar32);
      *(undefined8 *)(vertices + 0x12) = uVar1;
      vertices[0x14] = fVar19;
      vertices[0x15] = auVar33._0_4_;
      vertices[0x16] = auVar25._0_4_;
      vertices[0x17] = fVar19;
    }
    else {
      if (scale == (float *)0x0) {
        auVar25 = vmovshdup_avx(auVar20);
        fVar3 = auVar25._0_4_;
      }
      else {
        auVar34._8_4_ = 0x3f800000;
        auVar34._0_8_ = 0x3f8000003f800000;
        auVar34._12_4_ = 0x3f800000;
        uVar1 = vmovlps_avx(auVar25);
        *(undefined8 *)scale = uVar1;
        scale[2] = fVar35;
        auVar23 = vdivps_avx(auVar34,auVar25);
        fVar35 = 1.0 / fVar35;
        auVar20._0_4_ = auVar20._0_4_ * auVar23._0_4_;
        auVar20._4_4_ = fVar38 * auVar23._4_4_;
        auVar20._8_4_ = fVar39 * auVar23._8_4_;
        auVar20._12_4_ = fVar3 * auVar23._12_4_;
        auVar25 = vmovshdup_avx(auVar20);
        fVar3 = auVar25._0_4_;
        auVar33 = ZEXT416((uint)(fVar19 * fVar35));
      }
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar36._8_4_ = 0x7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar36._12_4_ = 0x7fffffff;
      uVar12 = -(uint)(scale == (float *)0x0);
      uVar14 = 0;
      for (uVar10 = 0; uVar13 = (uint)uVar14, uVar10 != svcount; uVar10 = uVar10 + 1) {
        pfVar11 = svertices + 2;
        uVar1 = *(undefined8 *)svertices;
        svertices = (float *)((long)svertices + (ulong)stride);
        uVar15 = 0;
        uVar9 = 0;
        fVar38 = (float)uVar1;
        fVar39 = (float)((ulong)uVar1 >> 0x20);
        fVar19 = (float)((uint)(scale == (float *)0x0) * (int)*pfVar11 +
                        (uint)(scale != (float *)0x0) * (int)(*pfVar11 * fVar35));
        bVar2 = (bool)((byte)uVar12 & 1);
        auVar21._0_4_ =
             (float)((uint)bVar2 * (int)fVar38 | (uint)!bVar2 * (int)(fVar38 * auVar23._0_4_));
        bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar21._4_4_ = (uint)bVar2 * (int)fVar39 | (uint)!bVar2 * (int)(fVar39 * auVar23._4_4_);
        auVar21._8_4_ = (uint)!(bool)((byte)(uVar12 >> 2) & 1) * (int)(auVar23._8_4_ * 0.0);
        auVar21._12_4_ = (uint)!(bool)((byte)(uVar12 >> 3) & 1) * (int)(auVar23._12_4_ * 0.0);
        auVar25 = vmovshdup_avx(auVar21);
        for (; uVar14 != uVar9; uVar9 = uVar9 + 1) {
          uVar17 = uVar15 & 0xffffffff;
          auVar27 = vandps_avx(ZEXT416((uint)(vertices[uVar17] - auVar21._0_4_)),auVar36);
          if (auVar27._0_4_ < normalepsilon) {
            auVar27 = vandps_avx(ZEXT416((uint)(vertices[uVar17 + 1] - auVar25._0_4_)),auVar37);
            if (auVar27._0_4_ < normalepsilon) {
              auVar27 = vandps_avx(ZEXT416((uint)(vertices[uVar17 + 2] - fVar19)),auVar37);
              if (auVar27._0_4_ < normalepsilon) {
                fVar38 = auVar25._0_4_ - fVar3;
                fVar39 = vertices[uVar17 + 1] - fVar3;
                auVar22 = vsubss_avx512f(ZEXT416((uint)fVar19),auVar33);
                auVar25 = ZEXT416((uint)(auVar21._0_4_ - auVar20._0_4_));
                auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar38 * fVar38)),auVar25,auVar25);
                auVar27 = ZEXT416((uint)(vertices[uVar17] - auVar20._0_4_));
                auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar39 * fVar39)),auVar27,auVar27);
                auVar22 = vfmadd231ss_avx512f(auVar25,auVar22,auVar22);
                auVar25 = ZEXT416((uint)(vertices[uVar17 + 2] - auVar33._0_4_));
                auVar25 = vfmadd231ss_fma(auVar27,auVar25,auVar25);
                if (auVar25._0_4_ < auVar22._0_4_) {
                  uVar1 = vmovlps_avx(auVar21);
                  *(undefined8 *)(vertices + uVar17) = uVar1;
                  vertices[uVar17 + 2] = fVar19;
                }
                if (uVar13 != (uint)uVar9) goto LAB_00e2c0fb;
                break;
              }
            }
          }
          uVar15 = uVar15 + 3;
        }
        uVar14 = (ulong)(uVar13 + 1);
        uVar1 = vmovlps_avx(auVar21);
        *(undefined8 *)(vertices + uVar13 * 3) = uVar1;
        vertices[(ulong)(uVar13 * 3) + 2] = fVar19;
        *vcount = uVar13 + 1;
LAB_00e2c0fb:
      }
      local_58 = 0x7f7fffff7f7fffff;
      local_50 = 3.4028235e+38;
      local_68 = 0xff7fffffff7fffff;
      local_60 = -3.4028235e+38;
      uVar12 = 0;
      for (uVar9 = 0; uVar9 != uVar14; uVar9 = uVar9 + 1) {
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          fVar19 = vertices[(ulong)uVar12 + lVar16];
          if (fVar19 < *(float *)((long)&local_58 + lVar16 * 4)) {
            *(float *)((long)&local_58 + lVar16 * 4) = fVar19;
          }
          if (*(float *)((long)&local_68 + lVar16 * 4) < fVar19) {
            *(float *)((long)&local_68 + lVar16 * 4) = fVar19;
          }
        }
        uVar12 = uVar12 + 3;
      }
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_68;
      local_60 = local_60 - local_50;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_58;
      auVar23 = vsubps_avx(auVar31,auVar28);
      auVar6._8_4_ = 0x358637bd;
      auVar6._0_8_ = 0x358637bd358637bd;
      auVar6._12_4_ = 0x358637bd;
      uVar14 = vcmpps_avx512vl(auVar23,auVar6,1);
      if (((2 < uVar13) && ((uVar14 & 1) == 0)) && (((uVar14 >> 1 & 1) == 0 && (1e-06 <= local_60)))
         ) goto LAB_00e2c3b4;
      auVar7._8_4_ = 0x3f000000;
      auVar7._0_8_ = 0x3f0000003f000000;
      auVar7._12_4_ = 0x3f000000;
      auVar22 = vfmadd231ps_avx512vl(auVar28,auVar23,auVar7);
      auVar20 = SUB6416(ZEXT464(0x358637bd),0);
      uVar1 = vcmpss_avx512f(auVar20,auVar23,2);
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar30 = ZEXT416((uint)local_60);
      auVar27 = vfmadd231ss_fma(ZEXT416((uint)local_50),auVar30,ZEXT416(0x3f000000));
      auVar25 = vminss_avx(auVar23,SUB6416(ZEXT464(0x7f7fffff),0));
      uVar12 = (uint)bVar2 * auVar25._0_4_ + (uint)!bVar2 * 0x7f7fffff;
      auVar33 = vmovshdup_avx(auVar23);
      auVar25 = vminss_avx(auVar33,ZEXT416(uVar12));
      uVar1 = vcmpss_avx512f(auVar20,auVar33,2);
      bVar2 = (bool)((byte)uVar1 & 1);
      uVar12 = (uint)bVar2 * auVar25._0_4_ + !bVar2 * uVar12;
      uVar1 = vcmpps_avx512vl(auVar20,auVar30,2);
      uVar4 = vcmpps_avx512vl(auVar30,ZEXT416(uVar12),1);
      bVar5 = (byte)uVar1 & (byte)uVar4;
      fVar19 = (float)((uint)(bVar5 & 1) * (int)local_60 + !(bool)(bVar5 & 1) * uVar12);
      if ((fVar19 != 3.4028235e+38) || (NAN(fVar19))) {
        auVar8._8_4_ = 0x358637bd;
        auVar8._0_8_ = 0x358637bd358637bd;
        auVar8._12_4_ = 0x358637bd;
        uVar14 = vcmpps_avx512vl(auVar23,auVar8,1);
        auVar25 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar19 * 0.05)));
        bVar2 = (bool)((byte)uVar14 & 1);
        auVar26._0_4_ = (uint)bVar2 * auVar25._0_4_ | (uint)!bVar2 * auVar23._0_4_;
        bVar2 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar26._4_4_ = (uint)bVar2 * auVar25._4_4_ | (uint)!bVar2 * auVar23._4_4_;
        bVar2 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar26._8_4_ = (uint)bVar2 * auVar25._8_4_ | (uint)!bVar2 * auVar23._8_4_;
        bVar2 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar26._12_4_ = (uint)bVar2 * auVar25._12_4_ | (uint)!bVar2 * auVar23._12_4_;
        fVar19 = fVar19 * 0.05;
        if (1e-06 <= local_60) {
          fVar19 = local_60;
        }
      }
      else {
        auVar26._8_4_ = 0x3c23d70a;
        auVar26._0_8_ = 0x3c23d70a3c23d70a;
        auVar26._12_4_ = 0x3c23d70a;
        fVar19 = 0.01;
      }
      auVar33 = vsubps_avx(auVar22,auVar26);
      auVar29._0_4_ = auVar22._0_4_ + auVar26._0_4_;
      auVar29._4_4_ = auVar22._4_4_ + auVar26._4_4_;
      auVar29._8_4_ = auVar22._8_4_ + auVar26._8_4_;
      auVar29._12_4_ = auVar22._12_4_ + auVar26._12_4_;
      fVar35 = auVar27._0_4_ - fVar19;
      fVar19 = auVar27._0_4_ + fVar19;
      auVar23 = vmovshdup_avx(auVar33);
      auVar25 = vmovshdup_avx(auVar29);
      uVar1 = vmovlps_avx(auVar33);
      *(undefined8 *)vertices = uVar1;
      vertices[2] = fVar35;
      vertices[4] = auVar23._0_4_;
      vertices[5] = fVar35;
      vertices[3] = auVar29._0_4_;
      uVar1 = vmovlps_avx(auVar29);
      *(undefined8 *)(vertices + 6) = uVar1;
      vertices[8] = fVar35;
      vertices[9] = auVar33._0_4_;
      vertices[10] = auVar25._0_4_;
      vertices[0xb] = fVar35;
      uVar1 = vmovlps_avx(auVar33);
      *(undefined8 *)(vertices + 0xc) = uVar1;
      vertices[0xe] = fVar19;
      vertices[0xf] = auVar29._0_4_;
      vertices[0x10] = auVar23._0_4_;
      vertices[0x11] = fVar19;
      uVar1 = vmovlps_avx(auVar29);
      *(undefined8 *)(vertices + 0x12) = uVar1;
      vertices[0x14] = fVar19;
      vertices[0x15] = auVar33._0_4_;
      vertices[0x16] = auVar25._0_4_;
      vertices[0x17] = fVar19;
    }
    *vcount = 8;
  }
LAB_00e2c3b4:
  return svcount != 0;
}

Assistant:

bool  HullLibrary::CleanupVertices(unsigned int svcount,
																const float *svertices,
																unsigned int stride,
																unsigned int &vcount,       // output number of vertices
																float *vertices,                 // location to store the results.
																float  normalepsilon,
																float *scale)
{
	if ( svcount == 0 ) return false;


#define EPSILON 0.000001f /* close enough to consider two floating point numbers to be 'the same'. */

	vcount = 0;

	float recip[3];

	if ( scale )
	{
		scale[0] = 1;
		scale[1] = 1;
		scale[2] = 1;
	}

	float bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
	float bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

	const char *vtx = (const char *) svertices;

	if ( 1 )
	{
		for (unsigned int i=0; i<svcount; i++)
		{
			const float *p = (const float *) vtx;

			vtx+=stride;

			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}
	}

	float dx = bmax[0] - bmin[0];
	float dy = bmax[1] - bmin[1];
	float dz = bmax[2] - bmin[2];

	float center[3];

	center[0] = dx*0.5f + bmin[0];
	center[1] = dy*0.5f + bmin[1];
	center[2] = dz*0.5f + bmin[2];

	if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || svcount < 3 )
	{

		float len = FLT_MAX;

		if ( dx > EPSILON && dx < len ) len = dx;
		if ( dy > EPSILON && dy < len ) len = dy;
		if ( dz > EPSILON && dz < len ) len = dz;

		if ( len == FLT_MAX )
		{
			dx = dy = dz = 0.01f; // one centimeter
		}
		else
		{
			if ( dx < EPSILON ) dx = len * 0.05f; // 1/5th the shortest non-zero edge.
			if ( dy < EPSILON ) dy = len * 0.05f;
			if ( dz < EPSILON ) dz = len * 0.05f;
		}

		float x1 = center[0] - dx;
		float x2 = center[0] + dx;

		float y1 = center[1] - dy;
		float y2 = center[1] + dy;

		float z1 = center[2] - dz;
		float z2 = center[2] + dz;

		addPoint(vcount,vertices,x1,y1,z1);
		addPoint(vcount,vertices,x2,y1,z1);
		addPoint(vcount,vertices,x2,y2,z1);
		addPoint(vcount,vertices,x1,y2,z1);
		addPoint(vcount,vertices,x1,y1,z2);
		addPoint(vcount,vertices,x2,y1,z2);
		addPoint(vcount,vertices,x2,y2,z2);
		addPoint(vcount,vertices,x1,y2,z2);

		return true; // return cube


	}
	else
	{
		if ( scale )
		{
			scale[0] = dx;
			scale[1] = dy;
			scale[2] = dz;

			recip[0] = 1 / dx;
			recip[1] = 1 / dy;
			recip[2] = 1 / dz;

			center[0]*=recip[0];
			center[1]*=recip[1];
			center[2]*=recip[2];

		}

	}



	vtx = (const char *) svertices;

	for (unsigned int i=0; i<svcount; i++)
	{

		const float *p = (const float *)vtx;
		vtx+=stride;

		float px = p[0];
		float py = p[1];
		float pz = p[2];

		if ( scale )
		{
			px = px*recip[0]; // normalize
			py = py*recip[1]; // normalize
			pz = pz*recip[2]; // normalize
		}

		if ( 1 )
		{
			unsigned int j;

			for (j=0; j<vcount; j++)
			{
				float *v = &vertices[j*3];

				float x = v[0];
				float y = v[1];
				float z = v[2];

				float dx = fabsf(x - px );
				float dy = fabsf(y - py );
				float dz = fabsf(z - pz );

				if ( dx < normalepsilon && dy < normalepsilon && dz < normalepsilon )
				{
					// ok, it is close enough to the old one
					// now let us see if it is further from the center of the point cloud than the one we already recorded.
					// in which case we keep this one instead.

					float dist1 = GetDist(px,py,pz,center);
					float dist2 = GetDist(v[0],v[1],v[2],center);

					if ( dist1 > dist2 )
					{
						v[0] = px;
						v[1] = py;
						v[2] = pz;
					}

					break;
				}
			}

			if ( j == vcount )
			{
				float *dest = &vertices[vcount*3];
				dest[0] = px;
				dest[1] = py;
				dest[2] = pz;
				vcount++;
			}
		}
	}

	// ok..now make sure we didn't prune so many vertices it is now invalid.
	if ( 1 )
	{
		float bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
		float bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

		for (unsigned int i=0; i<vcount; i++)
		{
			const float *p = &vertices[i*3];
			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}

		float dx = bmax[0] - bmin[0];
		float dy = bmax[1] - bmin[1];
		float dz = bmax[2] - bmin[2];

		if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || vcount < 3)
		{
			float cx = dx*0.5f + bmin[0];
			float cy = dy*0.5f + bmin[1];
			float cz = dz*0.5f + bmin[2];

			float len = FLT_MAX;

			if ( dx >= EPSILON && dx < len ) len = dx;
			if ( dy >= EPSILON && dy < len ) len = dy;
			if ( dz >= EPSILON && dz < len ) len = dz;

			if ( len == FLT_MAX )
			{
				dx = dy = dz = 0.01f; // one centimeter
			}
			else
			{
				if ( dx < EPSILON ) dx = len * 0.05f; // 1/5th the shortest non-zero edge.
				if ( dy < EPSILON ) dy = len * 0.05f;
				if ( dz < EPSILON ) dz = len * 0.05f;
			}

			float x1 = cx - dx;
			float x2 = cx + dx;

			float y1 = cy - dy;
			float y2 = cy + dy;

			float z1 = cz - dz;
			float z2 = cz + dz;

			vcount = 0; // add box

			addPoint(vcount,vertices,x1,y1,z1);
			addPoint(vcount,vertices,x2,y1,z1);
			addPoint(vcount,vertices,x2,y2,z1);
			addPoint(vcount,vertices,x1,y2,z1);
			addPoint(vcount,vertices,x1,y1,z2);
			addPoint(vcount,vertices,x2,y1,z2);
			addPoint(vcount,vertices,x2,y2,z2);
			addPoint(vcount,vertices,x1,y2,z2);

			return true;
		}
	}

	return true;
}